

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall
fmt::v7::detail::int_writer<fmt::v7::detail::buffer_appender<char>,_char,_unsigned_long>::on_dec
          (int_writer<fmt::v7::detail::buffer_appender<char>,_char,_unsigned_long> *this)

{
  uint64_t n;
  back_insert_iterator<fmt::v7::detail::buffer<char>_> bVar1;
  basic_format_specs<char> *in_RDI;
  int unaff_retaddr;
  undefined1 in_stack_00000008 [16];
  buffer_appender<char> in_stack_00000018;
  anon_class_16_2_cb75083a_for_f_conflict in_stack_00000030;
  int num_digits;
  basic_format_specs<char> *specs;
  
  n._0_1_ = in_RDI[1].type;
  n._1_1_ = in_RDI[1].field_0x9;
  n._2_1_ = in_RDI[1].fill.data_[0];
  n._3_1_ = in_RDI[1].fill.data_[1];
  n._4_1_ = in_RDI[1].fill.data_[2];
  n._5_1_ = in_RDI[1].fill.data_[3];
  n._6_1_ = in_RDI[1].fill.size_;
  n._7_1_ = in_RDI[1].field_0xf;
  specs = in_RDI;
  count_digits(n);
  get_prefix((int_writer<fmt::v7::detail::buffer_appender<char>,_char,_unsigned_long> *)0x1d32aa);
  bVar1.container =
       (buffer<char> *)
       write_int<fmt::v7::detail::buffer_appender<char>,char,fmt::v7::detail::int_writer<fmt::v7::detail::buffer_appender<char>,char,unsigned_long>::on_dec()::_lambda(fmt::v7::detail::buffer_appender<char>)_1_>
                 (in_stack_00000018,unaff_retaddr,(string_view)in_stack_00000008,specs,
                  in_stack_00000030);
  *(buffer<char> **)in_RDI = bVar1.container;
  return;
}

Assistant:

void on_dec() {
    auto num_digits = count_digits(abs_value);
    out = write_int(
        out, num_digits, get_prefix(), specs, [this, num_digits](iterator it) {
          return format_decimal<Char>(it, abs_value, num_digits).end;
        });
  }